

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O0

void __thiscall
ByteCodeGenerator::PopulateFormalsScope
          (ByteCodeGenerator *this,uint beginOffset,FuncInfo *funcInfo,ParseNodeFnc *pnodeFnc)

{
  anon_class_40_5_07c1c418 fn;
  anon_class_40_5_07c1c418 fn_00;
  uint *debuggerScope_00;
  DebuggerScope *pnodeFunc;
  ParseNodeFnc *funcInfo_00;
  bool bVar1;
  FunctionBody *this_00;
  Symbol *sym;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  uint *local_88;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 local_70;
  undefined8 uStack_68;
  uint *local_60;
  uint **local_58;
  anon_class_40_5_07c1c418 processArg;
  DebuggerScope *debuggerScope;
  ParseNodeFnc *pnodeFnc_local;
  FuncInfo *funcInfo_local;
  ByteCodeGenerator *pBStack_10;
  uint beginOffset_local;
  ByteCodeGenerator *this_local;
  
  processArg.beginOffset = (uint *)0x0;
  local_58 = &processArg.beginOffset;
  processArg.this = (ByteCodeGenerator *)&debuggerScope;
  processArg.pnodeFnc = &pnodeFnc_local;
  processArg.funcInfo = (FuncInfo **)((long)&funcInfo_local + 4);
  processArg.debuggerScope = (DebuggerScope **)this;
  debuggerScope = (DebuggerScope *)pnodeFnc;
  pnodeFnc_local = (ParseNodeFnc *)funcInfo;
  funcInfo_local._4_4_ = beginOffset;
  pBStack_10 = this;
  memcpy(&local_80,&local_58,0x28);
  fn.this = (ByteCodeGenerator *)uStack_78;
  fn.debuggerScope = (DebuggerScope **)local_80;
  fn.pnodeFnc = (ParseNodeFnc **)local_70;
  fn.funcInfo = (FuncInfo **)uStack_68;
  fn.beginOffset = local_60;
  MapFormals<ByteCodeGenerator::PopulateFormalsScope(unsigned_int,FuncInfo*,ParseNodeFnc*)::__0>
            (pnodeFnc,fn);
  pnodeFunc = debuggerScope;
  memcpy(&local_a8,&local_58,0x28);
  fn_00.this = (ByteCodeGenerator *)uStack_a0;
  fn_00.debuggerScope = (DebuggerScope **)local_a8;
  fn_00.pnodeFnc = (ParseNodeFnc **)local_98;
  fn_00.funcInfo = (FuncInfo **)uStack_90;
  fn_00.beginOffset = local_88;
  MapFormalsFromPattern<ByteCodeGenerator::PopulateFormalsScope(unsigned_int,FuncInfo*,ParseNodeFnc*)::__0>
            ((ParseNodeFnc *)pnodeFunc,fn_00);
  if (processArg.beginOffset != (uint *)0x0) {
    this_00 = FuncInfo::GetParsedFunctionBody((FuncInfo *)pnodeFnc_local);
    bVar1 = Js::FunctionBody::IsParamAndBodyScopeMerged(this_00);
    funcInfo_00 = pnodeFnc_local;
    debuggerScope_00 = processArg.beginOffset;
    if (!bVar1) {
      sym = FuncInfo::GetArgumentsSymbol((FuncInfo *)pnodeFnc_local);
      InsertPropertyToDebuggerScope
                (this,(FuncInfo *)funcInfo_00,(DebuggerScope *)debuggerScope_00,sym);
    }
    RecordEndScopeObject(this,(ParseNode *)debuggerScope);
  }
  return;
}

Assistant:

void ByteCodeGenerator::PopulateFormalsScope(uint beginOffset, FuncInfo *funcInfo, ParseNodeFnc *pnodeFnc)
{
    Js::DebuggerScope *debuggerScope = nullptr;
    auto processArg = [&](ParseNode *pnodeArg) {
        if (pnodeArg->IsVarLetOrConst())
        {
            if (debuggerScope == nullptr)
            {
                debuggerScope = RecordStartScopeObject(pnodeFnc, funcInfo->paramScope && funcInfo->paramScope->GetIsObject() ? Js::DiagParamScopeInObject : Js::DiagParamScope);
                debuggerScope->SetBegin(beginOffset);
            }

            InsertPropertyToDebuggerScope(funcInfo, debuggerScope, pnodeArg->AsParseNodeVar()->sym);
        }
    };

    MapFormals(pnodeFnc, processArg);
    MapFormalsFromPattern(pnodeFnc, processArg);

    if (debuggerScope != nullptr)
    {
        if (!funcInfo->GetParsedFunctionBody()->IsParamAndBodyScopeMerged())
        {
            InsertPropertyToDebuggerScope(funcInfo, debuggerScope, funcInfo->GetArgumentsSymbol());
        }

        RecordEndScopeObject(pnodeFnc);
    }
}